

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TryExpr::~TryExpr(TryExpr *this)

{
  TryExpr *this_local;
  
  *(undefined ***)this = &PTR__TryExpr_00273610;
  Var::~Var(&this->delegate_target);
  std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&this->catches);
  Block::~Block(&this->block);
  ExprMixin<(wabt::ExprType)60>::~ExprMixin((ExprMixin<(wabt::ExprType)60> *)this);
  return;
}

Assistant:

explicit TryExpr(const Location& loc = Location())
      : ExprMixin<ExprType::Try>(loc), kind(TryKind::Plain) {}